

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_gej_double(secp256k1_gej *r,secp256k1_gej *a)

{
  secp256k1_fe *r_00;
  secp256k1_fe local_a8;
  secp256k1_fe s;
  secp256k1_fe l;
  
  r->infinity = a->infinity;
  secp256k1_fe_impl_mul(&r->z,&a->z,&a->y);
  secp256k1_fe_impl_sqr(&s,&a->y);
  secp256k1_fe_impl_sqr(&l,&a->x);
  l.n[0] = l.n[0] * 3;
  l.n[1] = l.n[1] * 3;
  l.n[2] = l.n[2] * 3;
  l.n[3] = l.n[3] * 3;
  l.n[4] = l.n[4] * 3;
  secp256k1_fe_impl_half(&l);
  local_a8.n[0] = 0x3ffffbfffff0bc - s.n[0];
  local_a8.n[1] = 0x3ffffffffffffc - s.n[1];
  local_a8.n[2] = 0x3ffffffffffffc - s.n[2];
  local_a8.n[3] = 0x3ffffffffffffc - s.n[3];
  local_a8.n[4] = 0x3fffffffffffc - s.n[4];
  secp256k1_fe_impl_mul(&local_a8,&local_a8,&a->x);
  secp256k1_fe_impl_sqr(&r->x,&l);
  secp256k1_fe_impl_add(&r->x,&local_a8);
  secp256k1_fe_impl_add(&r->x,&local_a8);
  secp256k1_fe_impl_sqr(&s,&s);
  secp256k1_fe_impl_add(&local_a8,&r->x);
  r_00 = &r->y;
  secp256k1_fe_impl_mul(r_00,&local_a8,&l);
  secp256k1_fe_impl_add(r_00,&s);
  secp256k1_fe_impl_negate_unchecked(r_00,r_00,2);
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_gej_double(secp256k1_gej *r, const secp256k1_gej *a) {
    /* Operations: 3 mul, 4 sqr, 8 add/half/mul_int/negate */
    secp256k1_fe l, s, t;
    SECP256K1_GEJ_VERIFY(a);

    r->infinity = a->infinity;

    /* Formula used:
     * L = (3/2) * X1^2
     * S = Y1^2
     * T = -X1*S
     * X3 = L^2 + 2*T
     * Y3 = -(L*(X3 + T) + S^2)
     * Z3 = Y1*Z1
     */

    secp256k1_fe_mul(&r->z, &a->z, &a->y); /* Z3 = Y1*Z1 (1) */
    secp256k1_fe_sqr(&s, &a->y);           /* S = Y1^2 (1) */
    secp256k1_fe_sqr(&l, &a->x);           /* L = X1^2 (1) */
    secp256k1_fe_mul_int(&l, 3);           /* L = 3*X1^2 (3) */
    secp256k1_fe_half(&l);                 /* L = 3/2*X1^2 (2) */
    secp256k1_fe_negate(&t, &s, 1);        /* T = -S (2) */
    secp256k1_fe_mul(&t, &t, &a->x);       /* T = -X1*S (1) */
    secp256k1_fe_sqr(&r->x, &l);           /* X3 = L^2 (1) */
    secp256k1_fe_add(&r->x, &t);           /* X3 = L^2 + T (2) */
    secp256k1_fe_add(&r->x, &t);           /* X3 = L^2 + 2*T (3) */
    secp256k1_fe_sqr(&s, &s);              /* S' = S^2 (1) */
    secp256k1_fe_add(&t, &r->x);           /* T' = X3 + T (4) */
    secp256k1_fe_mul(&r->y, &t, &l);       /* Y3 = L*(X3 + T) (1) */
    secp256k1_fe_add(&r->y, &s);           /* Y3 = L*(X3 + T) + S^2 (2) */
    secp256k1_fe_negate(&r->y, &r->y, 2);  /* Y3 = -(L*(X3 + T) + S^2) (3) */

    SECP256K1_GEJ_VERIFY(r);
}